

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

ElementDocument * __thiscall Rml::Context::GetDocument(Context *this,String *id)

{
  __type _Var1;
  int iVar2;
  Element *this_00;
  ElementDocument *this_01;
  String *__lhs;
  int i;
  int index;
  
  index = 0;
  do {
    iVar2 = Element::GetNumChildren
                      ((this->root)._M_t.
                       super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
                       super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
                       super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,false);
    if (iVar2 <= index) {
      return (ElementDocument *)0x0;
    }
    this_00 = Element::GetChild((this->root)._M_t.
                                super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>
                                .super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl,index);
    this_01 = Element::GetOwnerDocument(this_00);
    if (this_01 != (ElementDocument *)0x0) {
      __lhs = Element::GetId_abi_cxx11_(&this_01->super_Element);
      _Var1 = ::std::operator==(__lhs,id);
      if (_Var1) {
        return this_01;
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

ElementDocument* Context::GetDocument(const String& id)
{
	for (int i = 0; i < root->GetNumChildren(); i++)
	{
		ElementDocument* document = root->GetChild(i)->GetOwnerDocument();
		if (document == nullptr)
			continue;

		if (document->GetId() == id)
			return document;
	}

	return nullptr;
}